

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall test_block60000_verification::test_method(test_block60000_verification *this)

{
  ethash_h256_t header_hash;
  ethash_light_t light;
  shared_count sStack_f0;
  ethash_h256_t seedhash;
  ethash_return_value_t ret;
  char *local_70;
  char *local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined8 *local_50;
  char **local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  light = ethash_light_new(60000);
  std::__cxx11::string::string
            ((string *)&ret,"5fc898f16035bf5ac9c6d9077ae1e3d5fc1ecc3c9fd5bee8bb00e810fdacbaa0",
             (allocator *)&local_60);
  stringToBlockhash(&seedhash,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  if (light != (ethash_light_t)0x0) {
    header_hash.b[8] = seedhash.b[8];
    header_hash.b[9] = seedhash.b[9];
    header_hash.b[10] = seedhash.b[10];
    header_hash.b[0xb] = seedhash.b[0xb];
    header_hash.b[0xc] = seedhash.b[0xc];
    header_hash.b[0xd] = seedhash.b[0xd];
    header_hash.b[0xe] = seedhash.b[0xe];
    header_hash.b[0xf] = seedhash.b[0xf];
    header_hash.b[0] = seedhash.b[0];
    header_hash.b[1] = seedhash.b[1];
    header_hash.b[2] = seedhash.b[2];
    header_hash.b[3] = seedhash.b[3];
    header_hash.b[4] = seedhash.b[4];
    header_hash.b[5] = seedhash.b[5];
    header_hash.b[6] = seedhash.b[6];
    header_hash.b[7] = seedhash.b[7];
    header_hash.b[0x10] = seedhash.b[0x10];
    header_hash.b[0x11] = seedhash.b[0x11];
    header_hash.b[0x12] = seedhash.b[0x12];
    header_hash.b[0x13] = seedhash.b[0x13];
    header_hash.b[0x14] = seedhash.b[0x14];
    header_hash.b[0x15] = seedhash.b[0x15];
    header_hash.b[0x16] = seedhash.b[0x16];
    header_hash.b[0x17] = seedhash.b[0x17];
    header_hash.b[0x18] = seedhash.b[0x18];
    header_hash.b[0x19] = seedhash.b[0x19];
    header_hash.b[0x1a] = seedhash.b[0x1a];
    header_hash.b[0x1b] = seedhash.b[0x1b];
    header_hash.b[0x1c] = seedhash.b[0x1c];
    header_hash.b[0x1d] = seedhash.b[0x1d];
    header_hash.b[0x1e] = seedhash.b[0x1e];
    header_hash.b[0x1f] = seedhash.b[0x1f];
    ethash_light_compute(&ret,light,header_hash,0x50377003e5d830ca);
    local_30 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_28 = "";
    local_40 = &boost::unit_test::basic_cstring<char_const>::null;
    local_38 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x285);
    ethash_check_difficulty(&ret.result,(ethash_h256_t *)&DAT_00129668);
    sStack_f0.pi_ = (sp_counted_base *)0x0;
    local_48 = &local_70;
    local_70 = "ethash_check_difficulty(&ret.result, &difficulty)";
    local_68 = "";
    local_58 = 0;
    local_60 = &PTR__lazy_ostream_0013b118;
    local_50 = &boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_f0);
    ethash_light_delete(light);
    return;
  }
  __assert_fail("light",
                "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
                ,0x27e,"void test_block60000_verification::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(test_block60000_verification) {
	// from POC-9 testnet, epoch 2
	ethash_light_t light = ethash_light_new(60000);
	ethash_h256_t seedhash = stringToBlockhash("5fc898f16035bf5ac9c6d9077ae1e3d5fc1ecc3c9fd5bee8bb00e810fdacbaa0");
	BOOST_ASSERT(light);
	ethash_return_value_t ret = ethash_light_compute(
		light,
		seedhash,
		0x50377003e5d830caU
	);
	ethash_h256_t difficulty = ethash_h256_static_init(0x25, 0xa6, 0x1e);
	BOOST_REQUIRE(ethash_check_difficulty(&ret.result, &difficulty));
	ethash_light_delete(light);
}